

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ENoSubScope.h
# Opt level: O2

void __thiscall ENoSubScope::ENoSubScope(ENoSubScope *this,string *arg)

{
  string local_30;
  
  std::__cxx11::string::string((string *)&local_30,(string *)arg);
  E::E(&this->super_E,&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  (this->super_E)._vptr_E = (_func_int **)&PTR__E_006040d0;
  return;
}

Assistant:

ENoSubScope(std::string arg):E(arg) {}